

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O0

aiColor4D __thiscall
Assimp::AMFImporter::SPP_Material::GetColor
          (SPP_Material *this,float param_1,float param_2,float param_3)

{
  undefined4 uVar1;
  undefined4 uVar2;
  CAMFImporter_NodeElement_Color *pCVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  aiColor4D aVar6;
  bool bVar7;
  DeadlyImportError *pDVar8;
  allocator local_89;
  string local_88;
  undefined1 local_65;
  allocator local_51;
  string local_50;
  float local_2c;
  float local_28;
  float param_3_local;
  float param_2_local;
  float param_1_local;
  SPP_Material *this_local;
  aiColor4D tcol;
  
  local_2c = param_3;
  local_28 = param_2;
  param_3_local = param_1;
  _param_2_local = this;
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)&this_local);
  bVar7 = std::__cxx11::
          list<Assimp::AMFImporter::SPP_Composite,_std::allocator<Assimp::AMFImporter::SPP_Composite>_>
          ::empty(&this->Composition);
  if (!bVar7) {
    local_65 = 1;
    pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"IME. GetColor for composition",&local_51);
    DeadlyImportError::DeadlyImportError(pDVar8,&local_50);
    local_65 = 0;
    __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if ((this->Color->Composed & 1U) != 0) {
    pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"IME. GetColor, composed color",&local_89);
    DeadlyImportError::DeadlyImportError(pDVar8,&local_88);
    __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pCVar3 = this->Color;
  uVar1 = (pCVar3->Color).r;
  uVar4 = (pCVar3->Color).g;
  uVar2 = (pCVar3->Color).b;
  uVar5 = (pCVar3->Color).a;
  this_local._0_4_ = (float)uVar1;
  this_local._4_4_ = (float)uVar4;
  tcol.r = (float)uVar2;
  tcol.g = (float)uVar5;
  if ((((((float)uVar1 == 0.0) && (!NAN((float)uVar1))) && ((float)uVar4 == 0.0)) &&
      ((!NAN((float)uVar4) && ((float)uVar2 == 0.0)))) &&
     ((!NAN((float)uVar2) && (((float)uVar5 == 0.0 && (!NAN((float)uVar5))))))) {
    this_local._0_4_ = 0.5;
    this_local._4_4_ = 0.5;
    tcol.r = 0.5;
    tcol.g = 1.0;
  }
  aVar6.g = this_local._4_4_;
  aVar6.r = this_local._0_4_;
  aVar6.b = tcol.r;
  aVar6.a = tcol.g;
  return aVar6;
}

Assistant:

aiColor4D AMFImporter::SPP_Material::GetColor(const float /*pX*/, const float /*pY*/, const float /*pZ*/) const
{
    aiColor4D tcol;

	// Check if stored data are supported.
	if(!Composition.empty())
	{
		throw DeadlyImportError("IME. GetColor for composition");
	}
	else if(Color->Composed)
	{
		throw DeadlyImportError("IME. GetColor, composed color");
	}
	else
	{
		tcol = Color->Color;
	}

	// Check if default color must be used
	if((tcol.r == 0) && (tcol.g == 0) && (tcol.b == 0) && (tcol.a == 0))
	{
		tcol.r = 0.5f;
		tcol.g = 0.5f;
		tcol.b = 0.5f;
		tcol.a = 1;
	}

	return tcol;
}